

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

int av1_get_refresh_frame_flags
              (AV1_COMP *cpi,EncodeFrameParams *frame_params,FRAME_UPDATE_TYPE frame_update_type,
              int gf_index,int cur_disp_order,RefFrameMapPair *ref_frame_map_pairs)

{
  long lVar1;
  int iVar2;
  AV1_COMMON *cm_00;
  int in_ECX;
  char in_DL;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  RefFrameMapPair *in_R9;
  int refresh_idx;
  int update_arf;
  int enable_refresh_skip;
  int free_fb_index;
  int ref_frame_map_idx;
  int ref_frame_map_idx_1;
  uint i;
  int refresh_mask;
  int new_fb_map_idx;
  RTC_REF *rtc_ref;
  GF_GROUP *gf_group;
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint local_5c;
  uint local_58;
  uint local_4;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  if (*(char *)(*in_RDI + 0x190a + (long)in_ECX) == '\0') {
    local_4 = 0xff;
  }
  else if (*(char *)(in_RSI + 4) == '\x03') {
    local_4 = 0xff;
  }
  else if (*(int *)(in_RSI + 0x18) == 0) {
    lVar1 = *in_RDI;
    iVar2 = is_frame_droppable((RTC_REF *)(lVar1 + 0x14d68),
                               (ExtRefreshFrameFlagsInfo *)((long)in_RDI + 0x42d84));
    if (iVar2 == 0) {
      if (((int)in_RDI[0x13acb] == 0) || (*(char *)((long)in_RDI + 0x9d661) != '\x01')) {
        local_58 = 0;
        if ((*(byte *)((long)in_RDI + 0x42d89) & 1) == 0) {
          iVar2 = get_free_ref_map_index(in_R9);
          if ((in_DL == '\x04') || (in_DL == '\x05')) {
            local_4 = 0;
          }
          else if (iVar2 == -1) {
            iVar2 = is_one_pass_rt_params
                              ((AV1_COMP *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            iVar2 = get_refresh_idx(in_R9,(uint)(in_DL == '\x03'),(GF_GROUP *)(*in_RDI + 400),in_ECX
                                    ,(uint)((iVar2 != 0 ^ 0xffU) & 1),in_R8D);
            local_4 = 1 << ((byte)iVar2 & 0x1f);
          }
          else {
            local_4 = 1 << ((byte)iVar2 & 0x1f);
          }
        }
        else if ((*(int *)(lVar1 + 0x14dc0) == 0) &&
                (iVar2 = use_rtc_reference_structure_one_layer
                                   ((AV1_COMP *)
                                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)),
                iVar2 == 0)) {
          iVar2 = get_ref_frame_map_idx(cm_00,'\x01');
          if (iVar2 != -1) {
            local_58 = (uint)(((ExtRefreshFrameFlagsInfo *)((long)in_RDI + 0x42d84))->last_frame & 1
                             ) << ((byte)iVar2 & 0x1f);
          }
          iVar2 = get_ref_frame_map_idx(cm_00,'\b');
          if (iVar2 != -1) {
            local_58 = (uint)(*(byte *)((long)in_RDI + 0x42d86) & 1) << ((byte)iVar2 & 0x1f) |
                       local_58;
          }
          iVar2 = get_ref_frame_map_idx(cm_00,'\x06');
          if (iVar2 != -1) {
            local_58 = (uint)(*(byte *)((long)in_RDI + 0x42d87) & 1) << ((byte)iVar2 & 0x1f) |
                       local_58;
          }
          if (in_DL == '\x04') {
            iVar2 = get_ref_frame_map_idx(cm_00,'\a');
            if (iVar2 != -1) {
              local_58 = (uint)(*(byte *)((long)in_RDI + 0x42d85) & 1) << ((byte)iVar2 & 0x1f) |
                         local_58;
            }
          }
          else {
            iVar2 = get_ref_frame_map_idx(cm_00,'\x04');
            if (iVar2 != -1) {
              local_58 = (uint)(*(byte *)((long)in_RDI + 0x42d85) & 1) << ((byte)iVar2 & 0x1f) |
                         local_58;
            }
            iVar2 = get_ref_frame_map_idx(cm_00,'\a');
            if (iVar2 != -1) {
              local_58 = (uint)(*(byte *)(in_RDI + 0x85b1) & 1) << ((byte)iVar2 & 0x1f) | local_58;
            }
          }
          local_4 = local_58;
        }
        else {
          for (local_5c = 0; local_5c < 7; local_5c = local_5c + 1) {
            iVar2 = *(int *)(lVar1 + 0x14d84 + (ulong)local_5c * 4);
            local_58 = *(int *)(lVar1 + 0x14da0 + (long)iVar2 * 4) << ((byte)iVar2 & 0x1f) |
                       local_58;
          }
          local_4 = local_58;
        }
      }
      else {
        iVar2 = *(int *)(*in_RDI + 0x29ac + (long)in_ECX * 4);
        if (iVar2 == -1) {
          local_4 = 0;
        }
        else {
          local_4 = 1 << ((byte)iVar2 & 0x1f);
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_get_refresh_frame_flags(
    const AV1_COMP *const cpi, const EncodeFrameParams *const frame_params,
    FRAME_UPDATE_TYPE frame_update_type, int gf_index, int cur_disp_order,
    RefFrameMapPair ref_frame_map_pairs[REF_FRAMES]) {
  const AV1_COMMON *const cm = &cpi->common;
  const ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &cpi->ext_flags.refresh_frame;

  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (gf_group->refbuf_state[gf_index] == REFBUF_RESET)
    return SELECT_ALL_BUF_SLOTS;

  // TODO(jingning): Deprecate the following operations.
  // Switch frames and shown key-frames overwrite all reference slots
  if (frame_params->frame_type == S_FRAME) return SELECT_ALL_BUF_SLOTS;

  // show_existing_frames don't actually send refresh_frame_flags so set the
  // flags to 0 to keep things consistent.
  if (frame_params->show_existing_frame) return 0;

  const RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  if (is_frame_droppable(rtc_ref, ext_refresh_frame_flags)) return 0;

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    int new_fb_map_idx = cpi->ppi->gf_group.update_ref_idx[gf_index];
    if (new_fb_map_idx == INVALID_IDX) return 0;
    return 1 << new_fb_map_idx;
  }
#endif  // !CONFIG_REALTIME_ONLY

  int refresh_mask = 0;
  if (ext_refresh_frame_flags->update_pending) {
    if (rtc_ref->set_ref_frame_config ||
        use_rtc_reference_structure_one_layer(cpi)) {
      for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        int ref_frame_map_idx = rtc_ref->ref_idx[i];
        refresh_mask |= rtc_ref->refresh[ref_frame_map_idx]
                        << ref_frame_map_idx;
      }
      return refresh_mask;
    }
    // Unfortunately the encoder interface reflects the old refresh_*_frame
    // flags so we have to replicate the old refresh_frame_flags logic here in
    // order to preserve the behaviour of the flag overrides.
    int ref_frame_map_idx = get_ref_frame_map_idx(cm, LAST_FRAME);
    if (ref_frame_map_idx != INVALID_IDX)
      refresh_mask |= ext_refresh_frame_flags->last_frame << ref_frame_map_idx;

    ref_frame_map_idx = get_ref_frame_map_idx(cm, EXTREF_FRAME);
    if (ref_frame_map_idx != INVALID_IDX)
      refresh_mask |= ext_refresh_frame_flags->bwd_ref_frame
                      << ref_frame_map_idx;

    ref_frame_map_idx = get_ref_frame_map_idx(cm, ALTREF2_FRAME);
    if (ref_frame_map_idx != INVALID_IDX)
      refresh_mask |= ext_refresh_frame_flags->alt2_ref_frame
                      << ref_frame_map_idx;

    if (frame_update_type == OVERLAY_UPDATE) {
      ref_frame_map_idx = get_ref_frame_map_idx(cm, ALTREF_FRAME);
      if (ref_frame_map_idx != INVALID_IDX)
        refresh_mask |= ext_refresh_frame_flags->golden_frame
                        << ref_frame_map_idx;
    } else {
      ref_frame_map_idx = get_ref_frame_map_idx(cm, GOLDEN_FRAME);
      if (ref_frame_map_idx != INVALID_IDX)
        refresh_mask |= ext_refresh_frame_flags->golden_frame
                        << ref_frame_map_idx;

      ref_frame_map_idx = get_ref_frame_map_idx(cm, ALTREF_FRAME);
      if (ref_frame_map_idx != INVALID_IDX)
        refresh_mask |= ext_refresh_frame_flags->alt_ref_frame
                        << ref_frame_map_idx;
    }
    return refresh_mask;
  }

  // Search for the open slot to store the current frame.
  int free_fb_index = get_free_ref_map_index(ref_frame_map_pairs);

  // No refresh necessary for these frame types.
  if (frame_update_type == OVERLAY_UPDATE ||
      frame_update_type == INTNL_OVERLAY_UPDATE)
    return refresh_mask;

  // If there is an open slot, refresh that one instead of replacing a
  // reference.
  if (free_fb_index != INVALID_IDX) {
    refresh_mask = 1 << free_fb_index;
    return refresh_mask;
  }
  const int enable_refresh_skip = !is_one_pass_rt_params(cpi);
  const int update_arf = frame_update_type == ARF_UPDATE;
  const int refresh_idx =
      get_refresh_idx(ref_frame_map_pairs, update_arf, &cpi->ppi->gf_group,
                      gf_index, enable_refresh_skip, cur_disp_order);
  return 1 << refresh_idx;
}